

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int __thiscall MlmWrap::addHfTypeToSubbedList(MlmWrap *this,HFSubSockSettings *socketInfo)

{
  bool bVar1;
  int iVar2;
  string local_f0;
  string local_d0;
  HighFreqDataType nData;
  
  HighFreqDataType::HighFreqDataType(&nData,&socketInfo->dataType);
  HighFreqDataType::getName_abi_cxx11_(&local_d0,&nData);
  HighFreqDataType::getOrigin_abi_cxx11_(&local_f0,&nData);
  bVar1 = isHfTypeCurrentlySubbed(this,&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (bVar1) {
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    std::vector<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>::push_back
              (&this->subbedHfDataTypes,socketInfo);
  }
  HighFreqDataType::~HighFreqDataType(&nData);
  return iVar2;
}

Assistant:

int MlmWrap::addHfTypeToSubbedList(HFSubSockSettings socketInfo) {
    HighFreqDataType nData = socketInfo.dataType;
    if (isHfTypeCurrentlySubbed(nData.getName(), nData.getOrigin()))
        return(-1);
    subbedHfDataTypes.push_back(socketInfo);
    return(0);
}